

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gga_x_vmt.c
# Opt level: O3

void gga_x_vmt_init(xc_func_type *p)

{
  uint uVar1;
  double *pdVar2;
  undefined8 *puVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  long extraout_RDX;
  long lVar7;
  long in_RSI;
  long *plVar8;
  long *in_R8;
  ulong uVar9;
  undefined8 uVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  undefined8 uVar16;
  double dVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  
  plVar8 = (long *)0x10;
  puVar3 = (undefined8 *)malloc(0x10);
  p->params = puVar3;
  uVar1 = p->info->number;
  uVar5 = (ulong)uVar1;
  if (uVar1 == 0x47) {
    uVar10 = 0x3fcc19110e80c25e;
    uVar16 = 0x3f66a055757d5a9f;
  }
  else {
    if (uVar1 != 0x46) {
      gga_x_vmt_init_cold_1();
      if (in_RSI != 0) {
        lVar7 = 0;
        do {
          lVar4 = (int)plVar8[9] * lVar7;
          dVar11 = *(double *)(extraout_RDX + lVar4 * 8);
          if ((int)plVar8[1] == 2) {
            dVar11 = dVar11 + *(double *)(extraout_RDX + 8 + lVar4 * 8);
          }
          dVar15 = (double)plVar8[0x30];
          if (dVar15 <= dVar11) {
            dVar11 = *(double *)(extraout_RDX + lVar4 * 8);
            if (dVar11 <= dVar15) {
              dVar11 = dVar15;
            }
            dVar12 = (double)plVar8[0x32] * (double)plVar8[0x32];
            dVar22 = *(double *)(uVar5 + *(int *)((long)plVar8 + 0x4c) * lVar7 * 8);
            if (dVar22 <= dVar12) {
              dVar22 = dVar12;
            }
            pdVar2 = (double *)plVar8[0x2f];
            dVar12 = (double)plVar8[0x31];
            dVar13 = cbrt(dVar11);
            dVar23 = *pdVar2;
            dVar14 = cbrt(9.869604401089358);
            auVar18._8_8_ = 1.0 / (dVar13 * dVar13);
            auVar18._0_8_ = 0x3ff0000000000000;
            auVar19._0_8_ = dVar14 * dVar14;
            auVar19._8_8_ = dVar11 * dVar11;
            auVar19 = divpd(auVar18,auVar19);
            dVar20 = auVar19._8_8_ * dVar22 * 1.5874010519681996;
            dVar17 = auVar19._0_8_;
            dVar14 = exp((pdVar2[1] * -1.8171205928321397 * dVar17 * dVar20) / 24.0);
            dVar21 = 0.0;
            if (dVar15 < dVar11 * 0.5) {
              dVar11 = (double)(-(ulong)(dVar12 < 1.0) & 0x3ff0000000000000 |
                               ~-(ulong)(dVar12 < 1.0) & (ulong)(dVar12 + -1.0 + 1.0));
              uVar9 = -(ulong)(dVar11 <= dVar12);
              dVar11 = (double)(uVar9 & (ulong)dVar12 | ~uVar9 & (ulong)dVar11);
              dVar15 = cbrt(dVar11);
              dVar23 = dVar23 * 1.8171205928321397;
              dVar21 = dVar13 * dVar15 * dVar11 * -0.36927938319101117 *
                       ((dVar14 * (1.0 / ((dVar20 * dVar23 * dVar17) / 24.0 + 1.0)) *
                         auVar19._8_8_ * 1.5874010519681996 * dVar23 * dVar22 * dVar17) / 24.0 + 1.0
                       );
              dVar21 = dVar21 + dVar21;
            }
            lVar4 = *in_R8;
            if ((lVar4 != 0) && ((*(byte *)(*plVar8 + 0x40) & 1) != 0)) {
              lVar6 = (int)plVar8[0xb] * lVar7;
              *(double *)(lVar4 + lVar6 * 8) = dVar21 + *(double *)(lVar4 + lVar6 * 8);
            }
          }
          lVar7 = lVar7 + 1;
        } while (in_RSI != lVar7);
      }
      return;
    }
    uVar10 = 0x3fbf9add3c0ca458;
    uVar16 = 0x3f5971c10d7be985;
  }
  *puVar3 = uVar10;
  puVar3[1] = uVar16;
  return;
}

Assistant:

static void
gga_x_vmt_init(xc_func_type *p)
{
  gga_x_vmt_params *params;

  assert(p != NULL && p->params == NULL);
  p->params = libxc_malloc(sizeof(gga_x_vmt_params));
  params = (gga_x_vmt_params *) (p->params);

  switch(p->info->number){
  case XC_GGA_X_VMT_PBE:
    params->mu    = 0.2195149727645171;
    params->alpha = 0.002762;
    break;
  case XC_GGA_X_VMT_GE:
    params->mu = 10.0/81.0;
    params->alpha = 0.001553;
    break;
  default:
    fprintf(stderr, "Internal error in gga_x_vmt\n");
    exit(1);
  }
}